

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O0

void __thiscall
TPZFrontNonSym<float>::ExtractFrontMatrix(TPZFrontNonSym<float> *this,TPZFMatrix<float> *front)

{
  int64_t iVar1;
  float *pfVar2;
  long *plVar3;
  long row;
  long col;
  long *in_RSI;
  long in_RDI;
  int64_t jl;
  int64_t il;
  int64_t jeq;
  int64_t numeq;
  int64_t mineq;
  int ilocal;
  int64_t maxeq;
  int64_t ieq;
  int64_t in_stack_ffffffffffffff98;
  long i;
  undefined4 in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  int64_t in_stack_ffffffffffffffb0;
  TPZFrontNonSym<float> *in_stack_ffffffffffffffb8;
  TPZFMatrix<float> *this_00;
  int64_t local_30;
  long local_18;
  
  iVar1 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x80));
  for (local_18 = *(long *)(in_RDI + 0xa8); local_18 < iVar1; local_18 = local_18 + 1) {
    Local(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    pfVar2 = Element((TPZFrontNonSym<float> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98,0x1d17100);
    *pfVar2 = 1.0;
  }
  local_30 = 0;
  while ((local_30 < iVar1 &&
         (plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),local_30), *plVar3 == -1
         ))) {
    local_30 = local_30 + 1;
  }
  (**(code **)(*in_RSI + 0x70))(in_RSI,iVar1 - local_30,iVar1 - local_30);
  for (local_18 = local_30; local_18 < iVar1; local_18 = local_18 + 1) {
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),local_18);
    if (*plVar3 != -1) {
      row = local_18 - local_30;
      for (this_00 = (TPZFMatrix<float> *)0x0; (long)this_00 < iVar1;
          this_00 = (TPZFMatrix<float> *)
                    ((long)&(this_00->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable.
                            _vptr_TPZSavable + 1)) {
        plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),(int64_t)this_00);
        if (*plVar3 != -1) {
          col = (long)this_00 - local_30;
          plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),local_18);
          i = *plVar3;
          TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x80),(int64_t)this_00);
          pfVar2 = Element((TPZFrontNonSym<float> *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),i,0x1d17262
                          );
          in_stack_ffffffffffffffa4 = *pfVar2;
          pfVar2 = TPZFMatrix<float>::operator()(this_00,row,col);
          *pfVar2 = in_stack_ffffffffffffffa4;
        }
      }
    }
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::ExtractFrontMatrix(TPZFMatrix<TVar> &front)
{
	// Extend the front with the non initialized rigid body modes
	int64_t ieq;
	int64_t maxeq = this->fLocal.NElements();
	for (ieq = this->fNextRigidBodyMode; ieq< maxeq; ieq++) {
		int ilocal = Local(ieq);
		Element(ilocal, ilocal) = 1.;
	}
	
	int64_t mineq = 0;
	for(mineq=0; mineq<maxeq; mineq++) if(this->fLocal[mineq] != -1) break;
	int64_t numeq = maxeq-mineq;
	front.Redim(numeq,numeq);
	int64_t jeq;
	for(ieq=mineq;ieq<maxeq;ieq++) {
		if(this->fLocal[ieq] == -1) continue;
		int64_t il = ieq-mineq;
		for(jeq=0;jeq<maxeq;jeq++) {
			if(this->fLocal[jeq] == -1) continue;
			int64_t jl = jeq-mineq;
			front(il,jl) = this->Element(this->fLocal[ieq],this->fLocal[jeq]);
		}
	}
	
}